

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuItemOptionBase::MenuEvent(FOptionMenuItemOptionBase *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  float volume;
  FSoundID local_34;
  uint local_30;
  FName local_2c;
  int Selection;
  FOptionValues **opt;
  bool fromcontroller_local;
  FOptionMenuItemOptionBase *pFStack_18;
  int mkey_local;
  FOptionMenuItemOptionBase *this_local;
  
  opt._3_1_ = fromcontroller;
  opt._4_4_ = mkey;
  pFStack_18 = this;
  FName::FName(&local_2c,(FName *)&(this->super_FOptionMenuItem).field_0x24);
  _Selection = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
               CheckKey(&OptionValues,&local_2c);
  if (((_Selection == (FOptionValues **)0x0) || (*_Selection == (FOptionValues *)0x0)) ||
     (uVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*_Selection)->mValues),
     uVar2 == 0)) {
    this_local._7_1_ =
         FListMenuItem::MenuEvent((FListMenuItem *)this,opt._4_4_,(bool)(opt._3_1_ & 1));
  }
  else {
    local_30 = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])();
    if (opt._4_4_ == 2) {
      if (local_30 == -1) {
        local_30 = 0;
      }
      else {
        local_30 = local_30 - 1;
        if ((int)local_30 < 0) {
          local_30 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*_Selection)->mValues)
          ;
          local_30 = local_30 - 1;
        }
      }
    }
    else {
      if ((opt._4_4_ != 3) && (opt._4_4_ != 6)) {
        bVar1 = FListMenuItem::MenuEvent((FListMenuItem *)this,opt._4_4_,(bool)(opt._3_1_ & 1));
        return bVar1;
      }
      uVar2 = local_30 + 1;
      local_30 = uVar2;
      uVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*_Selection)->mValues);
      if ((int)uVar3 <= (int)uVar2) {
        local_30 = 0;
      }
    }
    (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x14])
              (this,(ulong)local_30);
    FSoundID::FSoundID(&local_34,"menu/change");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_34,volume,0.0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MenuEvent (int mkey, bool fromcontroller)
	{
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && (*opt)->mValues.Size() > 0)
		{
			int Selection = GetSelection();
			if (mkey == MKEY_Left)
			{
				if (Selection == -1) Selection = 0;
				else if (--Selection < 0) Selection = (*opt)->mValues.Size()-1;
			}
			else if (mkey == MKEY_Right || mkey == MKEY_Enter)
			{
				if (++Selection >= (int)(*opt)->mValues.Size()) Selection = 0;
			}
			else
			{
				return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
			}
			SetSelection(Selection);
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		}
		else
		{
			return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
		}
		return true;
	}